

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectbox.hpp
# Opt level: O1

Transaction * __thiscall obx::Transaction::operator=(Transaction *this,Transaction *source)

{
  TxMode TVar1;
  OBX_txn *pOVar2;
  
  TVar1 = this->mode_;
  this->mode_ = source->mode_;
  source->mode_ = TVar1;
  pOVar2 = this->cTxn_;
  this->cTxn_ = source->cTxn_;
  source->cTxn_ = pOVar2;
  return this;
}

Assistant:

Transaction& Transaction::operator=(Transaction source) {
    std::swap(mode_, source.mode_);
    std::swap(cTxn_, source.cTxn_);
    return *this;
}